

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O2

void __thiscall
JSON::JSONScanner::BuildUnescapedString(JSONScanner *this,bool shouldSkipLastCharacter)

{
  char16 cVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  RangeCharacterPairList *pRVar7;
  char16 *obj;
  Type *pTVar8;
  uint uVar9;
  Memory *this_00;
  int iVar10;
  size_t sizeInWords;
  int i;
  int index;
  
  if (this->allocator == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x199,"(this->allocator != nullptr)","We must have built the allocator");
    if (!bVar5) goto LAB_00a3a124;
    *puVar6 = 0;
  }
  pRVar7 = this->currentRangeCharacterPairList;
  if (pRVar7 == (RangeCharacterPairList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x19a,"(this->currentRangeCharacterPairList != nullptr)",
                       "We must have built the currentRangeCharacterPairList");
    if (!bVar5) goto LAB_00a3a124;
    *puVar6 = 0;
    pRVar7 = this->currentRangeCharacterPairList;
  }
  if ((pRVar7->
      super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
      ).count < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x19b,"(this->currentRangeCharacterPairList->Count() > 0)",
                       "We need to build the current string only because we have escaped characters"
                      );
    if (!bVar5) goto LAB_00a3a124;
    *puVar6 = 0;
  }
  uVar2 = this->currentIndex;
  obj = this->stringBuffer;
  if (this->stringBufferLength < (int)uVar2) {
    this_00 = (Memory *)this->allocator;
    if (obj != (char16_t *)0x0) {
      Memory::DeleteArray<Memory::ArenaAllocator,char16_t>
                ((AllocatorType *)this_00,(long)this->stringBufferLength,obj);
      this->stringBuffer = (char16 *)0x0;
      this_00 = (Memory *)this->allocator;
    }
    obj = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                    (this_00,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,(long)(int)uVar2);
    this->stringBuffer = obj;
    this->stringBufferLength = uVar2;
  }
  iVar10 = (this->currentRangeCharacterPairList->
           super_ReadOnlyList<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_DefaultComparer>
           ).count + -1;
  uVar9 = 0;
  for (index = 0; index <= iVar10; index = index + 1) {
    pTVar8 = JsUtil::
             List<JSON::JSONScanner::RangeCharacterPair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this->currentRangeCharacterPairList,index);
    uVar3 = pTVar8->m_rangeLength;
    sizeInWords = (size_t)(int)uVar3;
    cVar1 = pTVar8->m_char;
    js_wmemcpy_s(obj,sizeInWords,this->inputText + pTVar8->m_rangeStart,sizeInWords);
    obj = obj + sizeInWords;
    uVar9 = uVar9 + uVar3;
    if (!shouldSkipLastCharacter || iVar10 != index) {
      *obj = cVar1;
      obj = obj + 1;
      uVar9 = uVar9 + 1;
    }
  }
  if (uVar9 != uVar2) {
    Output::TraceWithFlush
              (JSONPhase,L"BuildUnescapedString(): allocated size = %d != copying size %d\n");
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                       ,0x1c4,"(totalCopied == requiredSize)",
                       "BuildUnescapedString(): The allocated size and copying size should match.");
    if (!bVar5) {
LAB_00a3a124:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  Output::TraceWithFlush
            (JSONPhase,L"BuildUnescapedString(): unescaped string as \'%.*s\'\n",
             (ulong)this->currentIndex,this->stringBuffer);
  return;
}

Assistant:

void JSONScanner::BuildUnescapedString(bool shouldSkipLastCharacter)
    {
        AssertMsg(this->allocator != nullptr, "We must have built the allocator");
        AssertMsg(this->currentRangeCharacterPairList != nullptr, "We must have built the currentRangeCharacterPairList");
        AssertMsg(this->currentRangeCharacterPairList->Count() > 0, "We need to build the current string only because we have escaped characters");

        // Step 1: Ensure the buffer has sufficient space
        int requiredSize = this->GetCurrentStringLen();
        if (requiredSize > this->stringBufferLength)
        {
            if (this->stringBuffer)
            {
                AdeleteArray(this->allocator, this->stringBufferLength, this->stringBuffer);
                this->stringBuffer = nullptr;
            }

            this->stringBuffer = AnewArray(this->allocator, char16, requiredSize);
            this->stringBufferLength = requiredSize;
        }

        // Step 2: Copy the data to the buffer
        int totalCopied = 0;
        char16* begin_copy = this->stringBuffer;
        int lastCharacterIndex = this->currentRangeCharacterPairList->Count() - 1;
        for (int i = 0; i <= lastCharacterIndex; i++)
        {
            RangeCharacterPair data = this->currentRangeCharacterPairList->Item(i);
            int charactersToCopy = data.m_rangeLength;
            js_wmemcpy_s(begin_copy, charactersToCopy, this->inputText + data.m_rangeStart, charactersToCopy);
            begin_copy += charactersToCopy;
            totalCopied += charactersToCopy;

            if (i == lastCharacterIndex && shouldSkipLastCharacter)
            {
                continue;
            }

            *begin_copy = data.m_char;
            begin_copy++;
            totalCopied++;
        }

        if (totalCopied != requiredSize)
        {
            OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("BuildUnescapedString(): allocated size = %d != copying size %d\n"), requiredSize, totalCopied);
            AssertMsg(totalCopied == requiredSize, "BuildUnescapedString(): The allocated size and copying size should match.");
        }

        OUTPUT_TRACE_DEBUGONLY(Js::JSONPhase, _u("BuildUnescapedString(): unescaped string as '%.*s'\n"), GetCurrentStringLen(), this->stringBuffer);
    }